

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.cpp
# Opt level: O3

bool MeCab::anon_unknown_20::connect<false>
               (size_t pos,Node *rnode,Node **begin_node_list,Node **end_node_list,
               Connector *connector,Allocator<mecab_node_t,_mecab_path_t> *allocator)

{
  Node **ppNVar1;
  Node *pNVar2;
  Node *pNVar3;
  long lVar4;
  long lVar5;
  Node *pNVar6;
  
  if (rnode != (Node *)0x0) {
    ppNVar1 = begin_node_list + pos;
    do {
      pNVar3 = *ppNVar1;
      if (pNVar3 == (Node *)0x0) {
        return false;
      }
      pNVar6 = (Node *)0x0;
      lVar4 = 0x7fffffff;
      do {
        lVar5 = (long)*(short *)((long)&end_node_list[3]->prev +
                                (ulong)pNVar3->rcAttr * 2 +
                                (ulong)rnode->lcAttr * (ulong)*(ushort *)(end_node_list + 4) * 2) +
                (long)rnode->wcost + pNVar3->cost;
        pNVar2 = pNVar3;
        if (lVar4 <= lVar5) {
          lVar5 = lVar4;
          pNVar2 = pNVar6;
        }
        pNVar6 = pNVar2;
        pNVar3 = pNVar3->enext;
        lVar4 = lVar5;
      } while (pNVar3 != (mecab_node_t *)0x0);
      if (pNVar6 == (Node *)0x0) {
        return false;
      }
      rnode->prev = pNVar6;
      rnode->next = (mecab_node_t *)0x0;
      rnode->cost = lVar5;
      rnode->enext = ppNVar1[rnode->rlength];
      ppNVar1[rnode->rlength] = rnode;
      rnode = rnode->bnext;
    } while (rnode != (mecab_node_t *)0x0);
  }
  return true;
}

Assistant:

bool connect(size_t pos, Node *rnode,
                                       Node **begin_node_list,
                                       Node **end_node_list,
                                       const Connector *connector,
                                       Allocator<Node, Path> *allocator) {
  for (;rnode; rnode = rnode->bnext) {
    register long best_cost = 2147483647;
    Node* best_node = 0;
    for (Node *lnode = end_node_list[pos]; lnode; lnode = lnode->enext) {
      register int lcost = connector->cost(lnode, rnode);  // local cost
      register long cost = lnode->cost + lcost;

      if (cost < best_cost) {
        best_node  = lnode;
        best_cost  = cost;
  }

      if (IsAllPath) {
        Path *path   = allocator->newPath();
        path->cost   = lcost;
        path->rnode  = rnode;
        path->lnode  = lnode;
        path->lnext  = rnode->lpath;
        rnode->lpath = path;
        path->rnext  = lnode->rpath;
        lnode->rpath = path;
      }
    }

    // overflow check 2003/03/09
    if (!best_node) {
      return false;
  }

    rnode->prev = best_node;
    rnode->next = 0;
    rnode->cost = best_cost;
    const size_t x = rnode->rlength + pos;
    rnode->enext = end_node_list[x];
    end_node_list[x] = rnode;
  }

  return true;
  }